

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
DebugDrawcallback::processTriangle
          (DebugDrawcallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  cbtVector3 *pcVar1;
  float fVar2;
  float fVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  float fVar11;
  float fVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  uint uVar15;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  cbtVector3 center;
  undefined1 local_118 [8];
  float fStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  fVar20 = triangle->m_floats[1];
  fVar21 = (this->m_worldTrans).m_basis.m_el[0].m_floats[1];
  fVar2 = (this->m_worldTrans).m_basis.m_el[1].m_floats[1];
  fVar3 = (this->m_worldTrans).m_basis.m_el[2].m_floats[1];
  cVar4 = triangle->m_floats[0];
  cVar5 = (this->m_worldTrans).m_basis.m_el[0].m_floats[0];
  cVar6 = (this->m_worldTrans).m_basis.m_el[1].m_floats[0];
  cVar7 = (this->m_worldTrans).m_basis.m_el[2].m_floats[0];
  cVar8 = triangle->m_floats[2];
  cVar9 = (this->m_worldTrans).m_basis.m_el[0].m_floats[2];
  cVar10 = (this->m_worldTrans).m_basis.m_el[1].m_floats[2];
  fVar11 = (this->m_worldTrans).m_origin.m_floats[1];
  fVar12 = (this->m_worldTrans).m_origin.m_floats[2];
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar21)),ZEXT416((uint)cVar4),
                            ZEXT416((uint)cVar5));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar20)),ZEXT416((uint)cVar4),
                            ZEXT416((uint)cVar6));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar20)),ZEXT416((uint)cVar7),
                            ZEXT416((uint)cVar4));
  cVar4 = (this->m_worldTrans).m_basis.m_el[2].m_floats[2];
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar8),ZEXT416((uint)cVar10));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar8),ZEXT416((uint)cVar9));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar4),ZEXT416((uint)cVar8));
  fVar20 = (this->m_worldTrans).m_origin.m_floats[0];
  auVar22 = ZEXT416((uint)(auVar16._0_4_ + fVar20));
  auVar23 = ZEXT416((uint)(auVar17._0_4_ + fVar11));
  auVar16 = vinsertps_avx(auVar22,auVar23,0x10);
  auVar19 = ZEXT416((uint)(fVar12 + auVar18._0_4_));
  _local_118 = vinsertps_avx(auVar16,auVar19,0x28);
  cVar8 = triangle[1].m_floats[1];
  cVar13 = triangle[1].m_floats[0];
  cVar14 = triangle[1].m_floats[2];
  auVar16 = vmulss_avx512f(ZEXT416((uint)fVar21),ZEXT416((uint)cVar8));
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)cVar8));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)cVar8));
  auVar16 = vfmadd231ss_avx512f(auVar16,ZEXT416((uint)cVar13),ZEXT416((uint)cVar5));
  auVar17 = vfmadd231ss_avx512f(auVar17,ZEXT416((uint)cVar13),ZEXT416((uint)cVar6));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar7),ZEXT416((uint)cVar13));
  auVar17 = vfmadd231ss_avx512f(auVar17,ZEXT416((uint)cVar14),ZEXT416((uint)cVar10));
  auVar16 = vfmadd231ss_avx512f(auVar16,ZEXT416((uint)cVar14),ZEXT416((uint)cVar9));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar4),ZEXT416((uint)cVar14));
  local_98 = vaddss_avx512f(ZEXT416((uint)fVar20),auVar16);
  local_a8 = vaddss_avx512f(ZEXT416((uint)fVar11),auVar17);
  local_88 = vaddss_avx512f(ZEXT416((uint)fVar12),auVar18);
  auVar16 = vinsertps_avx512f(local_98,local_a8,0x10);
  auVar19 = vaddss_avx512f(auVar19,local_88);
  local_58 = vinsertps_avx512f(auVar16,local_88,0x28);
  cVar8 = triangle[2].m_floats[1];
  cVar13 = triangle[2].m_floats[0];
  auVar16 = vmulss_avx512f(ZEXT416((uint)fVar21),ZEXT416((uint)cVar8));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar13),ZEXT416((uint)cVar5));
  cVar5 = triangle[2].m_floats[2];
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar5),ZEXT416((uint)cVar9));
  auVar17 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)cVar8));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)cVar8));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar13),ZEXT416((uint)cVar6));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar13),ZEXT416((uint)cVar7));
  fVar20 = fVar20 + auVar16._0_4_;
  auVar16 = vfmadd231ss_fma(auVar17,ZEXT416((uint)cVar5),ZEXT416((uint)cVar10));
  auVar17 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar5),ZEXT416((uint)cVar4));
  auVar18 = vaddss_avx512f(auVar23,local_a8);
  local_e8 = ZEXT416((uint)fVar20);
  fVar11 = fVar11 + auVar16._0_4_;
  fVar12 = fVar12 + auVar17._0_4_;
  local_f8 = ZEXT416((uint)fVar11);
  auVar16 = vinsertps_avx(local_e8,local_f8,0x10);
  local_108 = ZEXT416((uint)fVar12);
  local_68 = vinsertps_avx(auVar16,local_108,0x28);
  auVar16 = vaddss_avx512f(auVar22,local_98);
  local_c8 = ZEXT416((uint)((auVar16._0_4_ + fVar20) * 0.33333334));
  local_d8 = ZEXT416((uint)((auVar18._0_4_ + fVar11) * 0.33333334));
  auVar16 = vinsertps_avx(local_c8,local_d8,0x10);
  local_b8 = ZEXT416((uint)((auVar19._0_4_ + fVar12) * 0.33333334));
  local_78 = vinsertps_avx(auVar16,local_b8,0x28);
  uVar15 = (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xe])
                     (this->m_debugDrawer,triangle,CONCAT44(in_register_00000014,partId),
                      CONCAT44(in_register_0000000c,triangleIndex));
  if ((uVar15 >> 0xe & 1) != 0) {
    fVar20 = local_108._0_4_ - fStack_110;
    auVar17 = vfmsub231ss_fma(ZEXT416((uint)(((float)local_f8._0_4_ - (float)local_118._4_4_) *
                                            ((float)local_88._0_4_ - fStack_110))),
                              ZEXT416((uint)((float)local_a8._0_4_ - (float)local_118._4_4_)),
                              ZEXT416((uint)fVar20));
    auVar16 = vfmsub231ss_fma(ZEXT416((uint)(fVar20 * ((float)local_98._0_4_ -
                                                      (float)local_118._0_4_))),
                              ZEXT416((uint)((float)local_e8._0_4_ - (float)local_118._0_4_)),
                              ZEXT416((uint)((float)local_88._0_4_ - fStack_110)));
    auVar18 = vfmsub231ss_fma(ZEXT416((uint)(((float)local_e8._0_4_ - (float)local_118._0_4_) *
                                            ((float)local_a8._0_4_ - (float)local_118._4_4_))),
                              ZEXT416((uint)((float)local_98._0_4_ - (float)local_118._0_4_)),
                              ZEXT416((uint)((float)local_f8._0_4_ - (float)local_118._4_4_)));
    fVar21 = auVar16._0_4_;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar17,auVar17);
    auVar16 = vfmadd231ss_fma(auVar16,auVar18,auVar18);
    auVar16 = vsqrtss_avx(auVar16,auVar16);
    fVar20 = 1.0 / auVar16._0_4_;
    local_48 = 0x3f8000003f800000;
    uStack_40 = 0;
    auVar16 = vinsertps_avx(ZEXT416((uint)(auVar17._0_4_ * fVar20 + (float)local_c8._0_4_)),
                            ZEXT416((uint)(fVar21 * fVar20 + (float)local_d8._0_4_)),0x10);
    local_38 = vinsertps_avx(auVar16,ZEXT416((uint)(auVar18._0_4_ * fVar20 + (float)local_b8._0_4_))
                             ,0x28);
    (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_78);
  }
  pcVar1 = &this->m_color;
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_118,local_58,pcVar1);
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_58,local_68,pcVar1);
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_68,local_118,pcVar1);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		(void)partId;
		(void)triangleIndex;

		cbtVector3 wv0, wv1, wv2;
		wv0 = m_worldTrans * triangle[0];
		wv1 = m_worldTrans * triangle[1];
		wv2 = m_worldTrans * triangle[2];
		cbtVector3 center = (wv0 + wv1 + wv2) * cbtScalar(1. / 3.);

		if (m_debugDrawer->getDebugMode() & cbtIDebugDraw::DBG_DrawNormals)
		{
			cbtVector3 normal = (wv1 - wv0).cross(wv2 - wv0);
			normal.normalize();
			cbtVector3 normalColor(1, 1, 0);
			m_debugDrawer->drawLine(center, center + normal, normalColor);
		}
		m_debugDrawer->drawLine(wv0, wv1, m_color);
		m_debugDrawer->drawLine(wv1, wv2, m_color);
		m_debugDrawer->drawLine(wv2, wv0, m_color);
	}